

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

Header * __thiscall Imf_2_5::Header::operator=(Header *this,Header *other)

{
  bool bVar1;
  pointer ppVar2;
  pointer this_00;
  Header *in_RSI;
  const_iterator in_RDI;
  const_iterator i_1;
  iterator i;
  Attribute *in_stack_00000550;
  char *in_stack_00000558;
  Header *in_stack_00000560;
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  *in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>
  *in_stack_ffffffffffffff90;
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  *in_stack_ffffffffffffff98;
  const_iterator in_stack_ffffffffffffffa8;
  _Self local_50;
  _Base_ptr local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> local_28;
  _Self local_20;
  _Self local_18 [3];
  
  if ((Header *)in_RDI._M_node != in_RSI) {
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::begin(in_stack_ffffffffffffff88);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::
           map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
           ::end(in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(local_18,&local_20);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>
                           *)0x13e730);
      in_stack_ffffffffffffff98 =
           (map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
            *)ppVar2->second;
      if (in_stack_ffffffffffffff98 !=
          (map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
           *)0x0) {
        (*(*(_func_int ***)&(in_stack_ffffffffffffff98->_M_t)._M_impl)[1])();
      }
      std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *)
                 in_stack_ffffffffffffff90);
    }
    local_30._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::begin(in_stack_ffffffffffffff88);
    std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
    _Rb_tree_const_iterator(&local_28,&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::end(in_stack_ffffffffffffff88);
    std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
    _Rb_tree_const_iterator(&local_38,&local_40);
    local_48 = (_Base_ptr)
               std::
               map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
               ::erase(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8,in_RDI);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::begin(in_stack_ffffffffffffff88);
    while( true ) {
      std::
      map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
      ::end(in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_50,(_Self *)&stack0xffffffffffffffa8);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>
                ::operator->(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff90 =
           (_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *)
           Name::operator*(&this_00->first);
      std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
      operator->(in_stack_ffffffffffffff90);
      insert(in_stack_00000560,in_stack_00000558,in_stack_00000550);
      std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
      operator++(in_stack_ffffffffffffff90);
    }
  }
  return (Header *)in_RDI._M_node;
}

Assistant:

Header &		
Header::operator = (const Header &other)
{
    if (this != &other)
    {
	for (AttributeMap::iterator i = _map.begin();
	     i != _map.end();
	     ++i)
	{
	     delete i->second;
	}

	_map.erase (_map.begin(), _map.end());

	for (AttributeMap::const_iterator i = other._map.begin();
	     i != other._map.end();
	     ++i)
	{
	    insert (*i->first, *i->second);
	}
    }

    return *this;
}